

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O2

void printSourceLine(raw_ostream *S,StringRef LineContents)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  char *From;
  StringRef SVar5;
  uint local_50;
  uint e;
  StringRef LineContents_local;
  
  LineContents_local.Data = (char *)LineContents.Length;
  _e = LineContents.Data;
  uVar4 = 0;
  uVar1 = 0;
  do {
    local_50 = (uint)LineContents.Length;
    if (uVar1 == local_50) {
LAB_00b67f96:
      llvm::raw_ostream::operator<<(S,'\n');
      return;
    }
    From = (char *)(ulong)uVar1;
    LineContents_local.Length._4_4_ = uVar1;
    pcVar2 = (char *)llvm::StringRef::find((StringRef *)&e,'\t',(size_t)From);
    if (pcVar2 == (char *)0xffffffffffffffff) {
      SVar5 = llvm::StringRef::drop_front((StringRef *)&e,(size_t)From);
      llvm::raw_ostream::operator<<(S,SVar5);
      goto LAB_00b67f96;
    }
    if (LineContents_local.Data < From) {
      From = LineContents_local.Data;
    }
    pcVar3 = pcVar2;
    if (pcVar2 < From) {
      pcVar3 = From;
    }
    if (LineContents_local.Data < pcVar2) {
      pcVar3 = LineContents_local.Data;
    }
    SVar5.Length = (long)pcVar3 - (long)From;
    SVar5.Data = From + (long)_e;
    llvm::raw_ostream::operator<<(S,SVar5);
    uVar4 = (uVar4 - LineContents_local.Length._4_4_) + (int)pcVar2;
    do {
      llvm::raw_ostream::operator<<(S,' ');
      uVar4 = uVar4 + 1;
    } while ((uVar4 & 7) != 0);
    uVar1 = (int)pcVar2 + 1;
  } while( true );
}

Assistant:

static void printSourceLine(raw_ostream &S, StringRef LineContents) {
  // Print out the source line one character at a time, so we can expand tabs.
  for (unsigned i = 0, e = LineContents.size(), OutCol = 0; i != e; ++i) {
    size_t NextTab = LineContents.find('\t', i);
    // If there were no tabs left, print the rest, we are done.
    if (NextTab == StringRef::npos) {
      S << LineContents.drop_front(i);
      break;
    }

    // Otherwise, print from i to NextTab.
    S << LineContents.slice(i, NextTab);
    OutCol += NextTab - i;
    i = NextTab;

    // If we have a tab, emit at least one space, then round up to 8 columns.
    do {
      S << ' ';
      ++OutCol;
    } while ((OutCol % TabStop) != 0);
  }
  S << '\n';
}